

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O0

void SHtest(double *x,int N,int *f,int Nseas,double *season)

{
  double **seasonal_00;
  double *pdVar1;
  double *remainder_00;
  double *vec;
  double dVar2;
  double dVar3;
  double local_88;
  double local_80;
  double tmp1;
  double vare;
  double *vari;
  double *remainder;
  double *trend;
  double **seasonal;
  int local_38;
  int Niter;
  int j;
  int i;
  double *season_local;
  int *piStack_20;
  int Nseas_local;
  int *f_local;
  double *pdStack_10;
  int N_local;
  double *x_local;
  
  _j = season;
  season_local._4_4_ = Nseas;
  piStack_20 = f;
  f_local._4_4_ = N;
  pdStack_10 = x;
  seasonal_00 = (double **)calloc((long)Nseas,8);
  for (Niter = 0; Niter < season_local._4_4_; Niter = Niter + 1) {
    pdVar1 = (double *)calloc((long)f_local._4_4_,8);
    seasonal_00[Niter] = pdVar1;
  }
  pdVar1 = (double *)calloc((long)f_local._4_4_,8);
  remainder_00 = (double *)calloc((long)f_local._4_4_,8);
  vec = (double *)calloc((long)f_local._4_4_,8);
  seasonal._4_4_ = season_local._4_4_;
  mstl(pdStack_10,f_local._4_4_,piStack_20,(int *)((long)&seasonal + 4),(int *)0x0,(double *)0x0,
       (int *)0x0,seasonal_00,pdVar1,remainder_00);
  dVar2 = var(remainder_00,f_local._4_4_);
  for (local_38 = 0; local_38 < seasonal._4_4_; local_38 = local_38 + 1) {
    for (Niter = 0; Niter < f_local._4_4_; Niter = Niter + 1) {
      vec[Niter] = remainder_00[Niter] + seasonal_00[local_38][Niter];
    }
    dVar3 = var(vec,f_local._4_4_);
    local_80 = 1.0 - dVar2 / dVar3;
    if (1.0 <= local_80) {
      local_80 = 1.0;
    }
    if (local_80 <= 0.0) {
      local_88 = 0.0;
    }
    else {
      local_88 = local_80;
    }
    _j[local_38] = local_88;
  }
  for (Niter = 0; Niter < season_local._4_4_; Niter = Niter + 1) {
    free(seasonal_00[Niter]);
  }
  free(seasonal_00);
  free(pdVar1);
  free(remainder_00);
  free(vec);
  return;
}

Assistant:

void SHtest(double *x, int N, int *f, int Nseas, double *season) {
    /*
    Seasonal Heuristic Test
    */
    int i,j,Niter;
    double **seasonal, *trend, *remainder, *vari;
    double vare,tmp1;

    seasonal = (double**)calloc(Nseas,sizeof(double*));
    for(i = 0; i < Nseas;++i) {
        seasonal[i] = (double*)calloc(N,sizeof(double));
    }
    trend = (double*)calloc(N,sizeof(double));
    remainder = (double*)calloc(N,sizeof(double));
    vari = (double*)calloc(N,sizeof(double));

    /// memory leak fix, copy Nseas to Niter then pass address 
    /// of Niter to mstl as mstl has potential of modifying Niter
    /// which affects freeing of seasonal double array below
    Niter = Nseas;
    mstl(x, N,f,&Niter,NULL,NULL,NULL,seasonal,trend,remainder);

    vare = var(remainder,N);

    for(j = 0; j < Niter; ++j) {

        for(i = 0; i < N;++i) {
            vari[i] = remainder[i] + seasonal[j][i];
        }

        tmp1 = 1.0 - vare/var(vari,N);

        tmp1 = tmp1 < 1 ? tmp1 : 1;

        season[j] = tmp1 > 0 ? tmp1 : 0;

    }
    
    for(i = 0; i < Nseas;++i) {
        free(seasonal[i]);
    }

    free(seasonal);
    free(trend);
    free(remainder);
    free(vari);
}